

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

void __thiscall
helics::ValueFederateManager::addAlias
          (ValueFederateManager *this,Input *inp,string_view shortcutName)

{
  InterfaceHandle *existingValue;
  Core *pCVar1;
  string_view searchValue;
  string *psVar2;
  InvalidIdentifier *this_00;
  string_view message;
  handle inpHandle;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  handle local_48;
  handle local_30;
  
  local_58._M_str = shortcutName._M_str;
  local_58._M_len = shortcutName._M_len;
  if ((inp->super_Interface).handle.hid != -1700000000) {
    existingValue = &(inp->super_Interface).handle;
    pCVar1 = this->coreObject;
    psVar2 = Interface::getName_abi_cxx11_(&inp->super_Interface);
    (*pCVar1->_vptr_Core[0x45])
              (pCVar1,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p,local_58._M_len,
               local_58._M_str);
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock(&local_30,&this->inputs);
    searchValue._M_str = local_58._M_str;
    searchValue._M_len = local_58._M_len;
    gmlc::containers::
    DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::
    addSearchTerm(local_30.data,searchValue,existingValue);
    gmlc::libguarded::
    shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
    ::lock(&local_48,&this->targetIDs);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
    ::
    _M_emplace_equal<std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
                *)local_48.data,&local_58,existingValue);
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
    std::unique_lock<std::mutex>::~unique_lock(&local_30.m_handle_lock);
    return;
  }
  this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
  message._M_str = "input is invalid";
  message._M_len = 0x10;
  InvalidIdentifier::InvalidIdentifier(this_00,message);
  __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void ValueFederateManager::addAlias(const Input& inp, std::string_view shortcutName)
{
    if (inp.isValid()) {
        coreObject->addAlias(inp.getName(), shortcutName);
        auto inpHandle = inputs.lock();
        inpHandle->addSearchTerm(shortcutName, inp.handle);
        targetIDs.lock()->emplace(shortcutName, inp.handle);
    } else {
        throw(InvalidIdentifier("input is invalid"));
    }
}